

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__jpeg_test(stbi__context *s)

{
  undefined8 *__ptr;
  stbi__context *in_RDI;
  stbi__jpeg *j;
  int r;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  undefined4 local_4;
  
  __ptr = (undefined8 *)stbi__malloc(0x42a3d3);
  if (__ptr == (undefined8 *)0x0) {
    local_4 = stbi__err((char *)0x0);
  }
  else {
    *__ptr = in_RDI;
    stbi__setup_jpeg((stbi__jpeg *)0x42a409);
    local_4 = stbi__decode_jpeg_header
                        ((stbi__jpeg *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8)
                         ,(int)((ulong)__ptr >> 0x20));
    stbi__rewind(in_RDI);
    free(__ptr);
  }
  return local_4;
}

Assistant:

static int stbi__jpeg_test(stbi__context *s)
{
   int r;
   stbi__jpeg* j = (stbi__jpeg*)stbi__malloc(sizeof(stbi__jpeg));
   if (!j) return stbi__err("outofmem", "Out of memory");
   j->s = s;
   stbi__setup_jpeg(j);
   r = stbi__decode_jpeg_header(j, STBI__SCAN_type);
   stbi__rewind(s);
   STBI_FREE(j);
   return r;
}